

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O2

void __thiscall
icu_63::numparse::impl::AffixMatcherWarehouse::AffixMatcherWarehouse
          (AffixMatcherWarehouse *this,AffixTokenMatcherWarehouse *tokenWarehouse)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  AffixMatcher *pAVar3;
  long lVar4;
  undefined1 auVar5 [16];
  
  auVar2 = _DAT_0030fba0;
  auVar1 = _DAT_0030fb90;
  pAVar3 = this->fAffixMatchers + 1;
  lVar4 = 0;
  do {
    auVar5._8_4_ = (int)lVar4;
    auVar5._0_8_ = lVar4;
    auVar5._12_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar5 = (auVar5 | auVar1) ^ auVar2;
    if (auVar5._4_4_ == -0x80000000 && auVar5._0_4_ < -0x7ffffff7) {
      ((AffixMatcherWarehouse *)(pAVar3 + -1))->fAffixMatchers[0].super_NumberParseMatcher.
      _vptr_NumberParseMatcher = (_func_int **)&PTR__NumberParseMatcher_003d8e68;
      (pAVar3->super_NumberParseMatcher)._vptr_NumberParseMatcher =
           (_func_int **)&PTR__NumberParseMatcher_003d8e68;
    }
    lVar4 = lVar4 + 2;
    pAVar3 = pAVar3 + 2;
  } while (lVar4 != 10);
  lVar4 = 0;
  do {
    AffixPatternMatcher::AffixPatternMatcher
              ((AffixPatternMatcher *)
               ((long)this->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.stackArray +
               lVar4 + -0x18));
    lVar4 = lVar4 + 0x50;
  } while (lVar4 != 0x1e0);
  this->fTokenWarehouse = tokenWarehouse;
  return;
}

Assistant:

AffixMatcherWarehouse::AffixMatcherWarehouse(AffixTokenMatcherWarehouse* tokenWarehouse)
        : fTokenWarehouse(tokenWarehouse) {
}